

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O0

Order * __thiscall
wasm::CoalesceLocalsWithLearning::pickIndices::Generator::makeRandom(Generator *this)

{
  uint uVar1;
  Order *this_00;
  reference pvVar2;
  Function *this_01;
  size_t __n;
  iterator __last;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  uint local_1c;
  Order *pOStack_18;
  Index i;
  Order *ret;
  Generator *this_local;
  
  ret = (Order *)this;
  this_00 = (Order *)operator_new(0x20);
  Order::Order(this_00);
  pOStack_18 = this_00;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
             (ulong)(this->parent->super_CoalesceLocals).
                    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                    .
                    super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                    .numLocals);
  for (local_1c = 0; uVar1 = local_1c,
      local_1c <
      (this->parent->super_CoalesceLocals).
      super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
      .super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
      numLocals; local_1c = local_1c + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&pOStack_18->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                        (ulong)local_1c);
    *pvVar2 = uVar1;
  }
  if ((this->first & 1U) == 0) {
    local_30._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&pOStack_18->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
    this_01 = Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::getFunction
                        ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *
                         )&(this->parent->super_CoalesceLocals).
                           super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                           .
                           super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                        );
    __n = Function::getNumParams(this_01);
    local_28 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator+(&local_30,__n);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                       (&pOStack_18->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              (local_28,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         )__last._M_current,&this->noise);
  }
  else {
    this->first = false;
  }
  pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Generator::
  calculateFitness(wasm::CoalesceLocalsWithLearning::
  pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order__(this,pOStack_18);
  return pOStack_18;
}

Assistant:

Order* makeRandom() {
      auto* ret = new Order;
      ret->resize(parent->numLocals);
      for (Index i = 0; i < parent->numLocals; i++) {
        (*ret)[i] = i;
      }
      if (first) {
        // as the first guess, use the natural order. this is not arbitrary for
        // two reasons. first, there may be an inherent order in the input
        // (frequent indices are lower, etc.). second, by ensuring we start with
        // the natural order, we ensure we are at least as good as the
        // non-learning variant.
        // TODO: use ::pickIndices from the parent, so we literally get the
        //       simpler approach as our first option
        first = false;
      } else {
        // leave params alone, shuffle the rest
        std::shuffle(ret->begin() + parent->getFunction()->getNumParams(),
                     ret->end(),
                     noise);
      }
      calculateFitness(ret);
#ifdef CFG_LEARN_DEBUG
      order->dump("new rando");
#endif
      return ret;
    }